

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_tests::ListCoinsTest::test_method(ListCoinsTest *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  CoinFilterParams params;
  CoinFilterParams params_00;
  CRecipient recipient;
  variant_alternative_t<2UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar4;
  _Base_ptr p_Var5;
  char *coinControl;
  iterator pvVar6;
  iterator pvVar7;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar8;
  _Base_ptr p_Var9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  ListCoinsTestingSetup *pLVar10;
  ListCoinsTestingSetup *pLVar11;
  undefined8 in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 local_2a8 [8];
  ulong local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined2 local_1b8;
  undefined1 uStack_1b6;
  undefined5 uStack_1b5;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined2 local_190;
  undefined1 uStack_18e;
  undefined5 uStack_18d;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock53;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_158;
  undefined1 local_110;
  undefined8 local_108;
  undefined1 local_100;
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  list;
  string coinbaseAddress;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::GetPubKey((CPubKey *)&criticalblock56,
                  &(this->super_ListCoinsTestingSetup).super_TestChain100Setup.coinbaseKey);
  CPubKey::GetID((CKeyID *)&list,(CPubKey *)&criticalblock56);
  base_blob<160u>::ToString_abi_cxx11_(&coinbaseAddress,&list);
  list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &list._M_t._M_impl.super__Rb_tree_header._M_header;
  list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar6 = (iterator)0x277;
  pvVar7 = (iterator)0x0;
  list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock52,
             &((this->super_ListCoinsTestingSetup).wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x277,false);
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&criticalblock56,
            (this->super_ListCoinsTestingSetup).wallet._M_t.
            super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
            super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
            super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::operator=(&list._M_t,
              (_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x27a;
  file.m_begin = (iterator)&local_1e8;
  msg.m_end = pvVar7;
  msg.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f8,msg);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_200 = "";
  pUVar8 = &criticalblock52;
  criticalblock52.super_unique_lock._M_device =
       (mutex_type *)list._M_t._M_impl.super__Rb_tree_header._M_node_count;
  criticalblock55.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock55.super_unique_lock._M_device._4_4_,1);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock56,&local_208,0x27a,1,2,pUVar8,"list.size()",&criticalblock55,"1U");
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x27b;
  file_00.m_begin = (iterator)&local_218;
  msg_00.m_end = (iterator)pUVar8;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_228,
             msg_00);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_230 = "";
  pvVar4 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(list._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  base_blob<160u>::ToString_abi_cxx11_((string *)&criticalblock52,pvVar4);
  pvVar6 = (iterator)0x2;
  pUVar8 = &criticalblock52;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&criticalblock56,&local_238,0x27b,1,2,pUVar8,
             "std::get<PKHash>(list.begin()->first).ToString()",&coinbaseAddress,"coinbaseAddress");
  std::__cxx11::string::~string((string *)&criticalblock52);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x27c;
  file_01.m_begin = (iterator)&local_248;
  msg_01.m_end = (iterator)pUVar8;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_258,
             msg_01);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_260 = "";
  criticalblock52.super_unique_lock._M_device =
       (mutex_type *)
       (((long)list._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right -
        (long)list._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left) / 0xa0);
  pUVar8 = &criticalblock52;
  criticalblock55.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock55.super_unique_lock._M_device._4_4_,1);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock56,&local_268,0x27c,1,2,pUVar8,"list.begin()->second.size()",
             &criticalblock55,"1U");
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x27f;
  file_02.m_begin = (iterator)&local_278;
  msg_02.m_end = (iterator)pUVar8;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_288,
             msg_02);
  criticalblock55.super_unique_lock._M_owns = false;
  criticalblock55.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_290 = "";
  local_2a0 = 5000000000;
  coinControl = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  pLVar10 = &this->super_ListCoinsTestingSetup;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock53,
             &((this->super_ListCoinsTestingSetup).wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x27f,false);
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&DAT_00000001;
  criticalblock52.super_unique_lock._M_owns = false;
  criticalblock52.super_unique_lock._9_7_ = 0x775f05a0740;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = &criticalblock52;
  AvailableCoins((CoinsResult *)&criticalblock56,
                 (wallet *)
                 (this->super_ListCoinsTestingSetup).wallet._M_t.
                 super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                 super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                 super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CWallet *)0x0,
                 (CCoinControl *)coinControl,(optional<CFeeRate>)(auVar3 << 0x40),
                 (CoinFilterParams *)pLVar10);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock53.super_unique_lock);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&criticalblock55,&local_298,0x27f,1,2,&local_2a0,"50 * COIN",local_2a8,
             "(MaybeCheckNotHeld(wallet->cs_wallet), [&]() -> decltype(auto) { UniqueLock criticalblock53(MaybeCheckNotHeld(wallet->cs_wallet), \"wallet->cs_wallet\", \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 639); return AvailableCoins(*wallet).GetTotalAmount(); }())"
            );
  local_158._M_first._M_storage._M_storage[0] = 0xff;
  local_110 = 1;
  local_108 = 100000000;
  local_100 = 0;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._8_8_ = in_stack_fffffffffffffbd0;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._0_8_ = pLVar10;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._16_8_ = in_stack_fffffffffffffbd8;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._24_8_ = in_stack_fffffffffffffbe0;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._32_8_ = in_stack_fffffffffffffbe8;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._40_8_ = in_stack_fffffffffffffbf0;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._48_8_ = in_stack_fffffffffffffbf8;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._56_8_ = in_stack_fffffffffffffc00;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._64_8_ = in_stack_fffffffffffffc08;
  recipient.dest.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._72_8_ = in_stack_fffffffffffffc10;
  recipient.nAmount = in_stack_fffffffffffffc18;
  recipient._88_8_ = in_stack_fffffffffffffc20;
  pLVar11 = pLVar10;
  ListCoinsTestingSetup::AddTx(pLVar10,recipient);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_158._M_first);
  pvVar6 = (iterator)0x287;
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock52,
             &((pLVar10->wallet)._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x287,false);
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&criticalblock56,
            (pLVar10->wallet)._M_t.
            super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
            super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
            super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::operator=(&list._M_t,
              (_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x28a;
  file_03.m_begin = (iterator)&local_2b8;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2c8,
             msg_03);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_2d0 = "";
  pUVar8 = &criticalblock52;
  criticalblock52.super_unique_lock._M_device =
       (mutex_type *)list._M_t._M_impl.super__Rb_tree_header._M_node_count;
  criticalblock55.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock55.super_unique_lock._M_device._4_4_,1);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock56,&local_2d8,0x28a,1,2,pUVar8,"list.size()",&criticalblock55,"1U");
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x28b;
  file_04.m_begin = (iterator)&local_2e8;
  msg_04.m_end = (iterator)pUVar8;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f8,
             msg_04);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_300 = "";
  pvVar4 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(list._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  base_blob<160u>::ToString_abi_cxx11_((string *)&criticalblock52,pvVar4);
  pvVar6 = (iterator)0x2;
  pUVar8 = &criticalblock52;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&criticalblock56,&local_308,0x28b,1,2,pUVar8,
             "std::get<PKHash>(list.begin()->first).ToString()",&coinbaseAddress,"coinbaseAddress");
  std::__cxx11::string::~string((string *)&criticalblock52);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x28c;
  file_05.m_begin = (iterator)&local_318;
  msg_05.m_end = (iterator)pUVar8;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_328,
             msg_05);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_330 = "";
  criticalblock52.super_unique_lock._M_device =
       (mutex_type *)
       (((long)list._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right -
        (long)list._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left) / 0xa0);
  criticalblock55.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock55.super_unique_lock._M_device._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock56,&local_338,0x28c,1,2,&criticalblock52,"list.begin()->second.size()",
             &criticalblock55,"2U");
  pvVar6 = (iterator)0x290;
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock55,
             &((pLVar11->wallet)._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x290,false);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x291;
  file_06.m_begin = (iterator)&local_348;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_358,
             msg_06);
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_360 = "";
  local_1b0 = 1;
  uStack_1a8 = 2100000000000000;
  local_1a0 = 2100000000000000;
  uStack_198 = 0;
  local_190 = 1;
  uStack_18e = 1;
  params._35_5_ = uStack_18d;
  params.only_spendable = true;
  params.include_immature_coinbase = false;
  params.skip_locked = true;
  params.max_amount = 2100000000000000;
  params.min_amount = 1;
  params.min_sum_amount = 2100000000000000;
  params.max_count = 0;
  AvailableCoinsListUnspent
            ((CoinsResult *)&criticalblock56,
             (pLVar11->wallet)._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CCoinControl *)0x0,params
            );
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)CoinsResult::Size((CoinsResult *)&criticalblock56);
  local_2a0 = CONCAT44(local_2a0._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock52,&local_368,0x291,1,2,&criticalblock53,
             "AvailableCoinsListUnspent(*wallet).Size()",&local_2a0,"2U");
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  pLVar10 = pLVar11;
  for (p_Var5 = list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &list._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    p_Var2 = p_Var5[3]._M_right;
    for (p_Var9 = p_Var5[3]._M_left; p_Var9 != p_Var2; p_Var9 = p_Var9 + 5) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 &criticalblock56.super_unique_lock,
                 &((pLVar11->wallet)._M_t.
                   super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                   super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
                 "wallet->cs_wallet",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                 ,0x295,false);
      CWallet::LockCoin((pLVar11->wallet)._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (COutPoint *)(p_Var9 + 1),(WalletBatch *)0x0);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock56.super_unique_lock);
    }
  }
  pvVar6 = (iterator)0x29a;
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock55,
             &((pLVar10->wallet)._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x29a,false);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x29b;
  file_07.m_begin = (iterator)&local_378;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_388,
             msg_07);
  criticalblock52.super_unique_lock._8_8_ =
       criticalblock52.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock52.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_390 = "";
  local_1d8 = 1;
  uStack_1d0 = 2100000000000000;
  local_1c8 = 2100000000000000;
  uStack_1c0 = 0;
  local_1b8 = 1;
  uStack_1b6 = 1;
  params_00._35_5_ = uStack_1b5;
  params_00.only_spendable = true;
  params_00.include_immature_coinbase = false;
  params_00.skip_locked = true;
  params_00.max_amount = 2100000000000000;
  params_00.min_amount = 1;
  params_00.min_sum_amount = 2100000000000000;
  params_00.max_count = 0;
  AvailableCoinsListUnspent
            ((CoinsResult *)&criticalblock56,
             (pLVar10->wallet)._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CCoinControl *)0x0,
             params_00);
  criticalblock53.super_unique_lock._M_device =
       (mutex_type *)CoinsResult::Size((CoinsResult *)&criticalblock56);
  local_2a0 = local_2a0 & 0xffffffff00000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock52,&local_398,0x29b,1,2,&criticalblock53,
             "AvailableCoinsListUnspent(*wallet).Size()",&local_2a0,"0U");
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  pvVar6 = (iterator)0x2a0;
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock52,
             &((pLVar10->wallet)._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x2a0,false);
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&criticalblock56,
            (pLVar10->wallet)._M_t.
            super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
            super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
            super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::operator=(&list._M_t,
              (_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&criticalblock56);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2a3;
  file_08.m_begin = (iterator)&local_3a8;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3b8,
             msg_08);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_3c0 = "";
  pUVar8 = &criticalblock52;
  criticalblock52.super_unique_lock._M_device =
       (mutex_type *)list._M_t._M_impl.super__Rb_tree_header._M_node_count;
  criticalblock55.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock55.super_unique_lock._M_device._4_4_,1);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock56,&local_3c8,0x2a3,1,2,pUVar8,"list.size()",
             &criticalblock55.super_unique_lock,"1U");
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_3d0 = "";
  file_09.m_end = (iterator)0x2a4;
  file_09.m_begin = (iterator)&local_3d8;
  msg_09.m_end = (iterator)pUVar8;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)&stack0xfffffffffffffc18,msg_09);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  pvVar4 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)(list._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  base_blob<160u>::ToString_abi_cxx11_((string *)&criticalblock52,pvVar4);
  pvVar6 = (iterator)0x2;
  pUVar8 = &criticalblock52;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&criticalblock56,&stack0xfffffffffffffc08,0x2a4,1,2,pUVar8,
             "std::get<PKHash>(list.begin()->first).ToString()",&coinbaseAddress,"coinbaseAddress");
  std::__cxx11::string::~string((string *)&criticalblock52);
  file_10.m_end = (iterator)0x2a5;
  file_10.m_begin = &stack0xfffffffffffffbf8;
  msg_10.m_end = (iterator)pUVar8;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
             (size_t)&stack0xfffffffffffffbe8,msg_10);
  criticalblock56.super_unique_lock._M_owns = false;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  criticalblock52.super_unique_lock._M_device =
       (mutex_type *)
       (((long)list._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right -
        (long)list._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left) / 0xa0);
  criticalblock55.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock55.super_unique_lock._M_device._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&criticalblock56,&stack0xfffffffffffffbd8,0x2a5,1,2,&criticalblock52,
             "list.begin()->second.size()",&criticalblock55.super_unique_lock,"2U");
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree(&list._M_t);
  std::__cxx11::string::~string((string *)&coinbaseAddress);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(ListCoinsTest, ListCoinsTestingSetup)
{
    std::string coinbaseAddress = coinbaseKey.GetPubKey().GetID().ToString();

    // Confirm ListCoins initially returns 1 coin grouped under coinbaseKey
    // address.
    std::map<CTxDestination, std::vector<COutput>> list;
    {
        LOCK(wallet->cs_wallet);
        list = ListCoins(*wallet);
    }
    BOOST_CHECK_EQUAL(list.size(), 1U);
    BOOST_CHECK_EQUAL(std::get<PKHash>(list.begin()->first).ToString(), coinbaseAddress);
    BOOST_CHECK_EQUAL(list.begin()->second.size(), 1U);

    // Check initial balance from one mature coinbase transaction.
    BOOST_CHECK_EQUAL(50 * COIN, WITH_LOCK(wallet->cs_wallet, return AvailableCoins(*wallet).GetTotalAmount()));

    // Add a transaction creating a change address, and confirm ListCoins still
    // returns the coin associated with the change address underneath the
    // coinbaseKey pubkey, even though the change address has a different
    // pubkey.
    AddTx(CRecipient{PubKeyDestination{{}}, 1 * COIN, /*subtract_fee=*/false});
    {
        LOCK(wallet->cs_wallet);
        list = ListCoins(*wallet);
    }
    BOOST_CHECK_EQUAL(list.size(), 1U);
    BOOST_CHECK_EQUAL(std::get<PKHash>(list.begin()->first).ToString(), coinbaseAddress);
    BOOST_CHECK_EQUAL(list.begin()->second.size(), 2U);

    // Lock both coins. Confirm number of available coins drops to 0.
    {
        LOCK(wallet->cs_wallet);
        BOOST_CHECK_EQUAL(AvailableCoinsListUnspent(*wallet).Size(), 2U);
    }
    for (const auto& group : list) {
        for (const auto& coin : group.second) {
            LOCK(wallet->cs_wallet);
            wallet->LockCoin(coin.outpoint);
        }
    }
    {
        LOCK(wallet->cs_wallet);
        BOOST_CHECK_EQUAL(AvailableCoinsListUnspent(*wallet).Size(), 0U);
    }
    // Confirm ListCoins still returns same result as before, despite coins
    // being locked.
    {
        LOCK(wallet->cs_wallet);
        list = ListCoins(*wallet);
    }
    BOOST_CHECK_EQUAL(list.size(), 1U);
    BOOST_CHECK_EQUAL(std::get<PKHash>(list.begin()->first).ToString(), coinbaseAddress);
    BOOST_CHECK_EQUAL(list.begin()->second.size(), 2U);
}